

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O1

void correct_reed_solomon_destroy(correct_reed_solomon *rs)

{
  field_logarithm_t *__ptr;
  bool bVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  undefined4 uVar25;
  ulong uVar26;
  ulong uVar27;
  field_operation_t i;
  long lVar28;
  polynomial_t polynomial;
  polynomial_t polynomial_00;
  polynomial_t polynomial_01;
  polynomial_t polynomial_02;
  polynomial_t polynomial_03;
  polynomial_t polynomial_04;
  polynomial_t polynomial_05;
  polynomial_t polynomial_06;
  polynomial_t polynomial_07;
  polynomial_t polynomial_08;
  polynomial_t polynomial_09;
  polynomial_t polynomial_10;
  
  __ptr = (rs->field).log;
  free((rs->field).exp);
  free(__ptr);
  uVar2 = (rs->generator).coeff;
  uVar3 = (rs->generator).order;
  polynomial.order = uVar3;
  polynomial.coeff = (field_element_t *)uVar2;
  polynomial._12_4_ = 0;
  polynomial_destroy(polynomial);
  free(rs->generator_roots);
  uVar4 = (rs->encoded_polynomial).coeff;
  uVar5 = (rs->encoded_polynomial).order;
  polynomial_00.order = uVar5;
  polynomial_00.coeff = (field_element_t *)uVar4;
  polynomial_00._12_4_ = 0;
  polynomial_destroy(polynomial_00);
  uVar6 = (rs->encoded_remainder).coeff;
  uVar7 = (rs->encoded_remainder).order;
  polynomial_01.order = uVar7;
  polynomial_01.coeff = (field_element_t *)uVar6;
  polynomial_01._12_4_ = 0;
  polynomial_destroy(polynomial_01);
  if (rs->has_init_decode == true) {
    free(rs->syndromes);
    free(rs->modified_syndromes);
    uVar8 = (rs->received_polynomial).coeff;
    uVar9 = (rs->received_polynomial).order;
    polynomial_02.order = uVar9;
    polynomial_02.coeff = (field_element_t *)uVar8;
    polynomial_02._12_4_ = 0;
    polynomial_destroy(polynomial_02);
    uVar10 = (rs->error_locator).coeff;
    uVar11 = (rs->error_locator).order;
    polynomial_03.order = uVar11;
    polynomial_03.coeff = (field_element_t *)uVar10;
    polynomial_03._12_4_ = 0;
    polynomial_destroy(polynomial_03);
    uVar12 = (rs->error_locator_log).coeff;
    uVar13 = (rs->error_locator_log).order;
    polynomial_04.order = uVar13;
    polynomial_04.coeff = (field_element_t *)uVar12;
    polynomial_04._12_4_ = 0;
    polynomial_destroy(polynomial_04);
    uVar14 = (rs->erasure_locator).coeff;
    uVar15 = (rs->erasure_locator).order;
    polynomial_05.order = uVar15;
    polynomial_05.coeff = (field_element_t *)uVar14;
    polynomial_05._12_4_ = 0;
    polynomial_destroy(polynomial_05);
    free(rs->error_roots);
    free(rs->error_vals);
    free(rs->error_locations);
    uVar16 = (rs->last_error_locator).coeff;
    uVar17 = (rs->last_error_locator).order;
    polynomial_06.order = uVar17;
    polynomial_06.coeff = (field_element_t *)uVar16;
    polynomial_06._12_4_ = 0;
    polynomial_destroy(polynomial_06);
    uVar18 = (rs->error_evaluator).coeff;
    uVar19 = (rs->error_evaluator).order;
    polynomial_07.order = uVar19;
    polynomial_07.coeff = (field_element_t *)uVar18;
    polynomial_07._12_4_ = 0;
    polynomial_destroy(polynomial_07);
    uVar20 = (rs->error_locator_derivative).coeff;
    uVar21 = (rs->error_locator_derivative).order;
    polynomial_08.order = uVar21;
    polynomial_08.coeff = (field_element_t *)uVar20;
    polynomial_08._12_4_ = 0;
    polynomial_destroy(polynomial_08);
    if (rs->min_distance != 0) {
      uVar26 = 0;
      uVar27 = 1;
      do {
        free(rs->generator_root_exp[uVar26]);
        bVar1 = uVar27 < rs->min_distance;
        uVar26 = uVar27;
        uVar27 = (ulong)((int)uVar27 + 1);
      } while (bVar1);
    }
    free(rs->generator_root_exp);
    lVar28 = 0;
    do {
      free(rs->element_exp[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x100);
    free(rs->element_exp);
    uVar22 = rs->init_from_roots_scratch[0].coeff;
    uVar23 = rs->init_from_roots_scratch[0].order;
    polynomial_09.order = uVar23;
    polynomial_09.coeff = (field_element_t *)uVar22;
    polynomial_09._12_4_ = 0;
    polynomial_destroy(polynomial_09);
    uVar24 = rs->init_from_roots_scratch[1].coeff;
    uVar25 = rs->init_from_roots_scratch[1].order;
    polynomial_10.order = uVar25;
    polynomial_10.coeff = (field_element_t *)uVar24;
    polynomial_10._12_4_ = 0;
    polynomial_destroy(polynomial_10);
  }
  free(rs);
  return;
}

Assistant:

void correct_reed_solomon_destroy(correct_reed_solomon *rs) {
    field_destroy(rs->field);
    polynomial_destroy(rs->generator);
    free(rs->generator_roots);
    polynomial_destroy(rs->encoded_polynomial);
    polynomial_destroy(rs->encoded_remainder);
    if (rs->has_init_decode) {
        free(rs->syndromes);
        free(rs->modified_syndromes);
        polynomial_destroy(rs->received_polynomial);
        polynomial_destroy(rs->error_locator);
        polynomial_destroy(rs->error_locator_log);
        polynomial_destroy(rs->erasure_locator);
        free(rs->error_roots);
        free(rs->error_vals);
        free(rs->error_locations);
        polynomial_destroy(rs->last_error_locator);
        polynomial_destroy(rs->error_evaluator);
        polynomial_destroy(rs->error_locator_derivative);
        for (unsigned int i = 0; i < rs->min_distance; i++) {
            free(rs->generator_root_exp[i]);
        }
        free(rs->generator_root_exp);
        for (field_operation_t i = 0; i < 256; i++) {
            free(rs->element_exp[i]);
        }
        free(rs->element_exp);
        polynomial_destroy(rs->init_from_roots_scratch[0]);
        polynomial_destroy(rs->init_from_roots_scratch[1]);
    }
    free(rs);
}